

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestRspFileFailure::Run(BuildTestRspFileFailure *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  VirtualFileSystem *this_00;
  allocator<char> local_199;
  key_type local_198;
  allocator<char> local_171;
  key_type local_170;
  allocator<char> local_149;
  key_type local_148;
  size_type local_128;
  size_t files_removed;
  size_t files_created;
  string local_110;
  undefined1 local_f0 [8];
  string err;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildTestRspFileFailure *pBStack_10;
  int fail_count;
  BuildTestRspFileFailure *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule fail\n  command = fail\n  rspfile = $rspfile\n  rspfile_content = $long_command\nbuild out: fail in\n  rspfile = out.rsp\n  long_command = Another very long command\n"
              ,local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_00 = &(this->super_BuildTest).fs_;
    VirtualFileSystem::Tick(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"in",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(this_00,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::__cxx11::string::string((string *)local_f0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"out",(allocator<char> *)((long)&files_created + 7));
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_110,(string *)local_f0);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x690,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)((long)&files_created + 7));
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x691,"\"\" == err");
    if (bVar3) {
      files_removed =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&(this->super_BuildTest).fs_.files_created_);
      local_128 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_BuildTest).fs_.files_removed_);
      pTVar1 = g_current_test;
      bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_f0);
      testing::Test::Check
                (pTVar1,(bool)(~bVar3 & 1),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x696,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar3 = std::operator==("subcommand failed",
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f0);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x697,"\"subcommand failed\" == err");
      pTVar1 = g_current_test;
      if (bVar3) {
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
        bVar3 = testing::Test::Check
                          (pTVar1,sVar6 == 1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x698,"1u == command_runner_.commands_ran_.size()");
        pTVar1 = g_current_test;
        if (bVar3) {
          sVar7 = files_removed + 1;
          sVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->super_BuildTest).fs_.files_created_);
          bVar3 = testing::Test::Check
                            (pTVar1,sVar7 == sVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x69b,"files_created + 1 == fs_.files_created_.size()");
          pTVar1 = g_current_test;
          if (bVar3) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_148,"out.rsp",&local_149);
            sVar7 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&(this->super_BuildTest).fs_.files_created_,&local_148);
            bVar3 = testing::Test::Check
                              (pTVar1,sVar7 == 1,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x69c,"1u == fs_.files_created_.count(\"out.rsp\")");
            std::__cxx11::string::~string((string *)&local_148);
            std::allocator<char>::~allocator(&local_149);
            sVar7 = local_128;
            pTVar1 = g_current_test;
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              sVar8 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&(this->super_BuildTest).fs_.files_removed_);
              bVar3 = testing::Test::Check
                                (pTVar1,sVar7 == sVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                 ,0x69f,"files_removed == fs_.files_removed_.size()");
              pTVar1 = g_current_test;
              if (bVar3) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_170,"out.rsp",&local_171);
                sVar7 = std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(&(this->super_BuildTest).fs_.files_removed_,&local_170);
                bVar3 = testing::Test::Check
                                  (pTVar1,sVar7 == 0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                   ,0x6a0,"0u == fs_.files_removed_.count(\"out.rsp\")");
                std::__cxx11::string::~string((string *)&local_170);
                std::allocator<char>::~allocator(&local_171);
                pTVar1 = g_current_test;
                if (((bVar3 ^ 0xffU) & 1) == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_198,"out.rsp",&local_199);
                  pmVar9 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VirtualFileSystem::Entry>_>_>
                           ::operator[](&(this->super_BuildTest).fs_.files_,&local_198);
                  bVar3 = std::operator==("Another very long command",&pmVar9->contents);
                  bVar3 = testing::Test::Check
                                    (pTVar1,bVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                                     ,0x6a3,
                                     "\"Another very long command\" == fs_.files_[\"out.rsp\"].contents"
                                    );
                  std::__cxx11::string::~string((string *)&local_198);
                  std::allocator<char>::~allocator(&local_199);
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                    files_created._0_4_ = 0;
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    files_created._0_4_ = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  files_created._0_4_ = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                files_created._0_4_ = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              files_created._0_4_ = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            files_created._0_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          files_created._0_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        files_created._0_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      files_created._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, RspFileFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule fail\n"
    "  command = fail\n"
    "  rspfile = $rspfile\n"
    "  rspfile_content = $long_command\n"
    "build out: fail in\n"
    "  rspfile = out.rsp\n"
    "  long_command = Another very long command\n"));

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  size_t files_created = fs_.files_created_.size();
  size_t files_removed = fs_.files_removed_.size();

  EXPECT_FALSE(builder_.Build(&err));
  ASSERT_EQ("subcommand failed", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  // The RSP file was created
  ASSERT_EQ(files_created + 1, fs_.files_created_.size());
  ASSERT_EQ(1u, fs_.files_created_.count("out.rsp"));

  // The RSP file was NOT removed
  ASSERT_EQ(files_removed, fs_.files_removed_.size());
  ASSERT_EQ(0u, fs_.files_removed_.count("out.rsp"));

  // The RSP file contains what it should
  ASSERT_EQ("Another very long command", fs_.files_["out.rsp"].contents);
}